

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_latency.cpp
# Opt level: O0

void __thiscall cubeb_latency_Test::TestBody(cubeb_latency_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar__2;
  cubeb_stream_params params;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_;
  unique_ptr<cubeb,_void_(*)(cubeb_*)> cleanup_cubeb_at_exit;
  AssertionResult gtest_ar;
  uint32_t latency_frames;
  uint32_t preferred_rate;
  uint32_t max_channels;
  int r;
  cubeb *ctx;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  undefined5 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe75;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  undefined1 uVar3;
  AssertHelper in_stack_fffffffffffffe78;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe98;
  cubeb_stream_params *in_stack_fffffffffffffea0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffea8;
  AssertHelper in_stack_fffffffffffffeb0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffec8;
  AssertHelper local_118;
  Message local_110;
  undefined4 local_104;
  AssertionResult local_100;
  String local_f0;
  AssertHelper local_e0;
  Message local_d8;
  AssertionResult local_d0;
  AssertHelper local_c0;
  Message local_b8;
  undefined4 local_ac;
  AssertionResult local_a8;
  String local_98;
  AssertHelper local_88;
  Message local_80;
  AssertionResult local_78;
  code *local_68;
  uint local_4c;
  AssertHelper local_48;
  Message local_40;
  undefined4 local_34;
  AssertionResult local_30;
  int local_14;
  undefined8 local_10;
  
  local_10 = 0;
  local_14 = common_init((cubeb **)in_stack_fffffffffffffe80.ptr_,
                         (char *)in_stack_fffffffffffffe78.data_);
  local_34 = 0;
  testing::internal::EqHelper<false>::Compare<int,__0>
            ((char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
             (char *)in_stack_fffffffffffffe80.ptr_,(int *)in_stack_fffffffffffffe78.data_,
             (anon_enum_32 *)
             CONCAT17(in_stack_fffffffffffffe77,
                      CONCAT16(in_stack_fffffffffffffe76,
                               CONCAT15(in_stack_fffffffffffffe75,in_stack_fffffffffffffe70))));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_30);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe80.ptr_);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10753b);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_latency.cpp"
               ,0x12,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::Message::~Message((Message *)0x10758b);
  }
  local_4c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1075b0);
  if (local_4c != 0) {
    return;
  }
  local_68 = cubeb_destroy;
  std::unique_ptr<cubeb,void(*)(cubeb*)>::unique_ptr<void(*)(cubeb*),void>
            ((unique_ptr<cubeb,_void_(*)(cubeb_*)> *)
             CONCAT17(in_stack_fffffffffffffe77,
                      CONCAT16(in_stack_fffffffffffffe76,
                               CONCAT15(in_stack_fffffffffffffe75,in_stack_fffffffffffffe70))),
             (pointer)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
             (__enable_if_t<_is_lvalue_reference<void_(*)(cubeb_*)>::value,_void_(*&&)(cubeb_*)>)
             0x1075ee);
  local_14 = cubeb_get_max_channel_count
                       ((cubeb *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                        (uint32_t *)0x107603);
  uVar3 = local_14 == 0 || local_14 == -4;
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)
             CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffe76,
                                     CONCAT15(in_stack_fffffffffffffe75,in_stack_fffffffffffffe70)))
             ,(bool)in_stack_fffffffffffffe6f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_78);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe80.ptr_);
    testing::internal::GetBoolAssertionFailureMessage
              ((AssertionResult *)&local_98,&local_78.success_,
               "r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED","false");
    pcVar2 = testing::internal::String::c_str(&local_98);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_latency.cpp"
               ,0x18,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::internal::String::~String
              ((String *)
               CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffe76,
                                       CONCAT15(in_stack_fffffffffffffe75,in_stack_fffffffffffffe70)
                                      )));
    testing::Message::~Message((Message *)0x1076f9);
  }
  local_4c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10771e);
  if (local_4c == 0) {
    if (local_14 == 0) {
      local_ac = 0;
      testing::internal::CmpHelperGT<unsigned_int,unsigned_int>
                ((char *)in_stack_fffffffffffffec8.ptr_,in_stack_fffffffffffffec0,
                 (uint *)in_stack_fffffffffffffeb8.ptr_,&(in_stack_fffffffffffffeb0.data_)->type);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe80.ptr_);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1077a2);
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_latency.cpp"
                   ,0x1a,pcVar2);
        testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        testing::Message::~Message((Message *)0x1077f2);
      }
      local_4c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x107817);
      if (local_4c != 0) goto LAB_00107c91;
    }
    local_14 = cubeb_get_preferred_sample_rate
                         ((cubeb *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                          (uint32_t *)0x10783f);
    in_stack_fffffffffffffe76 = local_14 == 0 || local_14 == -4;
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)
               CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffe76,
                                       CONCAT15(in_stack_fffffffffffffe75,in_stack_fffffffffffffe70)
                                      )),(bool)in_stack_fffffffffffffe6f);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe80.ptr_);
      testing::internal::GetBoolAssertionFailureMessage
                ((AssertionResult *)&local_f0,&local_d0.success_,
                 "r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED","false");
      pcVar2 = testing::internal::String::c_str(&local_f0);
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_latency.cpp"
                 ,0x1e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      testing::internal::String::~String
                ((String *)
                 CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffe76,
                                         CONCAT15(in_stack_fffffffffffffe75,
                                                  in_stack_fffffffffffffe70))));
      testing::Message::~Message((Message *)0x107935);
    }
    local_4c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10795a);
    if (local_4c == 0) {
      if (local_14 == 0) {
        local_104 = 0;
        testing::internal::CmpHelperGT<unsigned_int,unsigned_int>
                  ((char *)in_stack_fffffffffffffec8.ptr_,in_stack_fffffffffffffec0,
                   (uint *)in_stack_fffffffffffffeb8.ptr_,&(in_stack_fffffffffffffeb0.data_)->type);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe80.ptr_);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1079de);
          testing::internal::AssertHelper::AssertHelper
                    (&local_118,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_latency.cpp"
                     ,0x20,pcVar2);
          testing::internal::AssertHelper::operator=(&local_118,&local_110);
          testing::internal::AssertHelper::~AssertHelper(&local_118);
          testing::Message::~Message((Message *)0x107a2e);
        }
        local_4c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x107a53);
        if (local_4c != 0) goto LAB_00107c91;
      }
      local_14 = cubeb_get_min_latency
                           ((cubeb *)in_stack_fffffffffffffea8.ptr_,in_stack_fffffffffffffea0,
                            (uint32_t *)in_stack_fffffffffffffe98.ptr_);
      in_stack_fffffffffffffe75 = local_14 == 0 || local_14 == -4;
      testing::AssertionResult::AssertionResult
                ((AssertionResult *)
                 CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffe76,
                                         CONCAT15(in_stack_fffffffffffffe75,
                                                  in_stack_fffffffffffffe70))),
                 (bool)in_stack_fffffffffffffe6f);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffec0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe80.ptr_);
        testing::internal::GetBoolAssertionFailureMessage
                  ((AssertionResult *)&stack0xfffffffffffffea0,&stack0xfffffffffffffec0,
                   "r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED","false");
        pcVar2 = testing::internal::String::c_str((String *)&stack0xfffffffffffffea0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffeb0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_latency.cpp"
                   ,0x2b,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffeb0,(Message *)&stack0xfffffffffffffeb8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffeb0);
        testing::internal::String::~String
                  ((String *)
                   CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffe76,
                                           CONCAT15(in_stack_fffffffffffffe75,
                                                    in_stack_fffffffffffffe70))));
        testing::Message::~Message((Message *)0x107b80);
      }
      local_4c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x107ba2);
      if (local_4c == 0) {
        if (local_14 == 0) {
          testing::internal::CmpHelperGT<unsigned_int,unsigned_int>
                    ((char *)in_stack_fffffffffffffec8.ptr_,in_stack_fffffffffffffec0,
                     (uint *)in_stack_fffffffffffffeb8.ptr_,&(in_stack_fffffffffffffeb0.data_)->type
                    );
          bVar1 = testing::AssertionResult::operator_cast_to_bool
                            ((AssertionResult *)&stack0xfffffffffffffe90);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffe80.ptr_);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x107c14);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xfffffffffffffe78,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_latency.cpp"
                       ,0x2d,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xfffffffffffffe78,(Message *)&stack0xfffffffffffffe80)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe78)
            ;
            testing::Message::~Message((Message *)0x107c55);
          }
          local_4c = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x107c77);
          if (local_4c != 0) goto LAB_00107c91;
        }
        local_4c = 0;
      }
    }
  }
LAB_00107c91:
  std::unique_ptr<cubeb,_void_(*)(cubeb_*)>::~unique_ptr
            ((unique_ptr<cubeb,_void_(*)(cubeb_*)> *)
             CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffe76,
                                     CONCAT15(in_stack_fffffffffffffe75,in_stack_fffffffffffffe70)))
            );
  return;
}

Assistant:

TEST(cubeb, latency)
{
  cubeb * ctx = NULL;
  int r;
  uint32_t max_channels;
  uint32_t preferred_rate;
  uint32_t latency_frames;

  r = common_init(&ctx, "Cubeb audio test");
  ASSERT_EQ(r, CUBEB_OK);

  std::unique_ptr<cubeb, decltype(&cubeb_destroy)>
    cleanup_cubeb_at_exit(ctx, cubeb_destroy);

  r = cubeb_get_max_channel_count(ctx, &max_channels);
  ASSERT_TRUE(r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED);
  if (r == CUBEB_OK) {
    ASSERT_GT(max_channels, 0u);
  }

  r = cubeb_get_preferred_sample_rate(ctx, &preferred_rate);
  ASSERT_TRUE(r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED);
  if (r == CUBEB_OK) {
    ASSERT_GT(preferred_rate, 0u);
  }

  cubeb_stream_params params = {
    CUBEB_SAMPLE_FLOAT32NE,
    preferred_rate,
    max_channels,
    CUBEB_LAYOUT_UNDEFINED,
    CUBEB_STREAM_PREF_NONE
  };
  r = cubeb_get_min_latency(ctx, &params, &latency_frames);
  ASSERT_TRUE(r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED);
  if (r == CUBEB_OK) {
    ASSERT_GT(latency_frames, 0u);
  }
}